

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O1

Fl_Color __thiscall Fl_Help_View::get_color(Fl_Help_View *this,char *n,Fl_Color c)

{
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  
  if ((n != (char *)0x0) && (*n != '\0')) {
    if (*n == '#') {
      uVar2 = strtol(n + 1,(char **)0x0,0x10);
      uVar5 = (uint)uVar2;
      sVar3 = strlen(n);
      if (sVar3 < 5) {
        iVar1 = ((int)uVar5 >> 8) * 0x11;
        uVar4 = (uint)(uVar2 >> 4) & 0xf;
        uVar4 = uVar4 << 4 | uVar4;
        uVar5 = (uVar5 & 0xf) << 4 | uVar5 & 0xf;
      }
      else {
        iVar1 = (int)uVar5 >> 0x10;
        uVar4 = (uint)(byte)(uVar2 >> 8);
      }
      if ((char)uVar5 == '\0' && ((char)uVar4 == '\0' && (char)iVar1 == '\0')) {
LAB_001b2585:
        c = 0x38;
      }
      else {
        uVar5 = uVar5 & 0xff | uVar4 << 8 | iVar1 << 0x10;
LAB_001b2580:
        c = uVar5 << 8;
      }
    }
    else {
      lVar6 = 0x10;
      do {
        iVar1 = strcasecmp(n,*(char **)((long)broken_xpm + lVar6 + 0xe0));
        if (iVar1 == 0) {
          iVar1 = *(int *)((long)broken_xpm + lVar6 + 0xe8);
          uVar5 = *(uint *)((long)broken_xpm + lVar6 + 0xec);
          uVar4 = *(uint *)((long)&get_color::colors[0].name + lVar6);
          if (((char)uVar5 == '\0' && (char)iVar1 == '\0') && (char)uVar4 == '\0')
          goto LAB_001b2585;
          uVar5 = uVar4 & 0xff | (uVar5 & 0xff) << 8 | iVar1 << 0x10;
          goto LAB_001b2580;
        }
        lVar6 = lVar6 + 0x18;
      } while (lVar6 != 0x1d8);
    }
  }
  return c;
}

Assistant:

Fl_Color				// O - Color value
Fl_Help_View::get_color(const char *n,	// I - Color name
                        Fl_Color   c)	// I - Default color value
{
  int	i;				// Looping var
  int	rgb, r, g, b;			// RGB values
  static const struct {			// Color name table
    const char *name;
    int r, g, b;
  }	colors[] = {
    { "black",		0x00, 0x00, 0x00 },
    { "red",		0xff, 0x00, 0x00 },
    { "green",		0x00, 0x80, 0x00 },
    { "yellow",		0xff, 0xff, 0x00 },
    { "blue",		0x00, 0x00, 0xff },
    { "magenta",	0xff, 0x00, 0xff },
    { "fuchsia",	0xff, 0x00, 0xff },
    { "cyan",		0x00, 0xff, 0xff },
    { "aqua",		0x00, 0xff, 0xff },
    { "white",		0xff, 0xff, 0xff },
    { "gray",		0x80, 0x80, 0x80 },
    { "grey",		0x80, 0x80, 0x80 },
    { "lime",		0x00, 0xff, 0x00 },
    { "maroon",		0x80, 0x00, 0x00 },
    { "navy",		0x00, 0x00, 0x80 },
    { "olive",		0x80, 0x80, 0x00 },
    { "purple",		0x80, 0x00, 0x80 },
    { "silver",		0xc0, 0xc0, 0xc0 },
    { "teal",		0x00, 0x80, 0x80 }
  };


  if (!n || !n[0]) return c;

  if (n[0] == '#') {
    // Do hex color lookup
    rgb = strtol(n + 1, NULL, 16);

    if (strlen(n) > 4) {
      r = rgb >> 16;
      g = (rgb >> 8) & 255;
      b = rgb & 255;
    } else {
      r = (rgb >> 8) * 17;
      g = ((rgb >> 4) & 15) * 17;
      b = (rgb & 15) * 17;
    }
    return (fl_rgb_color((uchar)r, (uchar)g, (uchar)b));
  } else {
    for (i = 0; i < (int)(sizeof(colors) / sizeof(colors[0])); i ++)
      if (!strcasecmp(n, colors[i].name)) {
        return fl_rgb_color(colors[i].r, colors[i].g, colors[i].b);
      }
    return c;
  }
}